

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>::
emplaceRealloc<slang::ast::OpaqueInstancePath::Entry>
          (SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *this,pointer pos,Entry *args)

{
  ulong uVar1;
  pointer p;
  pointer pEVar2;
  pointer pEVar3;
  pointer pEVar4;
  long lVar5;
  long lVar6;
  size_type sVar7;
  ulong uVar8;
  
  if (this->len == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  uVar8 = this->len + 1;
  uVar1 = this->cap;
  if (uVar8 < uVar1 * 2) {
    uVar8 = uVar1 * 2;
  }
  if (0xfffffffffffffff - uVar1 < uVar1) {
    uVar8 = 0xfffffffffffffff;
  }
  lVar6 = (long)pos - (long)this->data_;
  pEVar2 = (pointer)operator_new(uVar8 * 8);
  *(uintptr_t *)((long)pEVar2 + lVar6) = args->value;
  p = this->data_;
  sVar7 = this->len;
  lVar5 = (long)p + (sVar7 * 8 - (long)pos);
  pEVar3 = p;
  pEVar4 = pEVar2;
  if (lVar5 == 0) {
    pEVar3 = pEVar2;
    pEVar4 = p;
    if (sVar7 != 0) {
      do {
        pEVar3->value = pEVar4->value;
        pEVar4 = pEVar4 + 1;
        pEVar3 = pEVar3 + 1;
      } while (pEVar4 != pos);
    }
  }
  else {
    for (; pEVar3 != pos; pEVar3 = pEVar3 + 1) {
      pEVar4->value = pEVar3->value;
      pEVar4 = pEVar4 + 1;
    }
    memcpy((void *)((long)pEVar2 + lVar6 + 8),pos,(lVar5 - 8U & 0xfffffffffffffff8) + 8);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar7 = this->len;
  }
  this->len = sVar7 + 1;
  this->cap = uVar8;
  this->data_ = pEVar2;
  return (pointer)((long)pEVar2 + lVar6);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}